

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O3

int __thiscall Fl_Tree_Item_Array::move(Fl_Tree_Item_Array *this,int to,int from)

{
  Fl_Tree_Item *pFVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  if (from == to) {
    return 0;
  }
  if (to < 0) {
    return -1;
  }
  iVar3 = this->_total;
  if (iVar3 <= from) {
    return -1;
  }
  if (from < 0) {
    return -1;
  }
  if (iVar3 <= to) {
    return -1;
  }
  uVar4 = (ulong)(uint)from;
  pFVar1 = this->_items[uVar4];
  if ((uint)from < (uint)to) {
    do {
      this->_items[uVar4] = this->_items[uVar4 + 1];
      iVar3 = this->_total;
      if (to <= from + 1) break;
      bVar2 = from < iVar3;
      uVar4 = uVar4 + 1;
      from = from + 1;
    } while (bVar2);
  }
  else {
    if ((uint)from <= (uint)to) {
      this->_items[(uint)to] = pFVar1;
      goto LAB_00207533;
    }
    do {
      this->_items[(uint)from] = this->_items[(ulong)(uint)from - 1];
      from = from - 1;
    } while (to < from);
  }
  this->_items[(uint)to] = pFVar1;
  if (iVar3 < 1) {
    return 0;
  }
LAB_00207533:
  lVar5 = 0;
  do {
    Fl_Tree_Item::update_prev_next(this->_items[lVar5],(int)lVar5);
    lVar5 = lVar5 + 1;
  } while (lVar5 < this->_total);
  return 0;
}

Assistant:

int Fl_Tree_Item_Array::move(int to, int from) {
  if ( from == to ) return 0;    // nop
  if ( to<0 || to>=_total || from<0 || from>=_total ) return -1;
  Fl_Tree_Item *item = _items[from];
  // Remove item..
  if ( from < to )
    for ( int t=from; t<to && t<(_total+1); t++ )
      _items[t] = _items[t+1];
  else
    for ( int t=from; t>to && t>0; t-- )
      _items[t] = _items[t-1];
  // Move to new position
  _items[to] = item;
  // Update all children
  for ( int r=0; r<_total; r++ )	// XXX: excessive to do all children,
    _items[r]->update_prev_next(r);	// XXX: but avoids weird boundary issues
  return 0;
}